

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int X509_CRL_verify(X509_CRL *a,EVP_PKEY *r)

{
  int iVar1;
  EVP_PKEY *pkey_local;
  X509_CRL *crl_local;
  
  iVar1 = X509_ALGOR_cmp(a->sig_alg,a->crl->sig_alg);
  if (iVar1 == 0) {
    crl_local._4_4_ =
         ASN1_item_verify((ASN1_ITEM *)&X509_CRL_INFO_it,a->sig_alg,a->signature,a->crl,r);
  }
  else {
    ERR_put_error(0xb,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                  ,0x115);
    crl_local._4_4_ = 0;
  }
  return crl_local._4_4_;
}

Assistant:

int X509_CRL_verify(X509_CRL *crl, EVP_PKEY *pkey) {
  if (X509_ALGOR_cmp(crl->sig_alg, crl->crl->sig_alg) != 0) {
    OPENSSL_PUT_ERROR(X509, X509_R_SIGNATURE_ALGORITHM_MISMATCH);
    return 0;
  }

  return ASN1_item_verify(ASN1_ITEM_rptr(X509_CRL_INFO), crl->sig_alg,
                          crl->signature, crl->crl, pkey);
}